

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint * ON_GetPointLocationIds
                 (size_t point_dim,size_t point_count,size_t point_stride,float *points,
                 uint first_point_id,uint *point_ids,uint *point_id_index)

{
  uint *puVar1;
  uint *point_ids_local;
  uint first_point_id_local;
  float *points_local;
  size_t point_stride_local;
  size_t point_count_local;
  size_t point_dim_local;
  
  puVar1 = ON_GetPointLocationIdsHelper
                     (point_dim,point_count,point_stride,points,(double *)0x0,first_point_id,
                      point_ids,point_id_index);
  return puVar1;
}

Assistant:

unsigned int* ON_GetPointLocationIds(
  size_t point_dim,
  size_t point_count,
  size_t point_stride,
  const float* points,
  unsigned int first_point_id,
  unsigned int* point_ids,
  unsigned int* point_id_index
  )
{
  return ON_GetPointLocationIdsHelper(
    point_dim,
    point_count,
    point_stride,
    points,
    nullptr,
    first_point_id,
    point_ids,
    point_id_index
    );
}